

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translation.cpp
# Opt level: O0

vector<Quad_*,_std::allocator<Quad_*>_> * __thiscall
Translation::transform(Translation *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads)

{
  bool bVar1;
  vector<Quad_*,_std::allocator<Quad_*>_> *this_00;
  reference ppQVar2;
  Quad *this_01;
  Quad *local_48;
  Quad *local_40;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  vector<Quad_*,_std::allocator<Quad_*>_> *transformedQuads;
  vector<Quad_*,_std::allocator<Quad_*>_> *quads_local;
  Translation *this_local;
  
  this_00 = (vector<Quad_*,_std::allocator<Quad_*>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::vector(this_00);
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(quads);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(quads);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                *)&quad);
    if (!bVar1) break;
    ppQVar2 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    local_40 = *ppQVar2;
    this_01 = (Quad *)operator_new(0x20);
    Quad::Quad(this_01,local_40,this->direction);
    local_48 = this_01;
    std::vector<Quad_*,_std::allocator<Quad_*>_>::push_back(this_00,&local_48);
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  }
  return this_00;
}

Assistant:

vector<Quad*>* Translation::transform(vector<Quad*>* quads) {
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *quads) {
        transformedQuads->push_back(new Quad(quad, direction));
    }
    return transformedQuads;
}